

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O3

void __thiscall asl::Var::operator=(Var *this,uint x)

{
  Type TVar1;
  undefined4 in_register_00000034;
  
  if (this->_type != NONE) {
    free(this,(void *)CONCAT44(in_register_00000034,x));
  }
  if ((int)x < 0) {
    (this->field_1)._d = (double)x;
    TVar1 = NUMBER;
  }
  else {
    (this->field_1)._i = x;
    TVar1 = INT;
  }
  this->_type = TVar1;
  return;
}

Assistant:

void Var::operator=(unsigned x)
{
	if(_type == NONE){}
	else
		free();
	if (x & 0x80000000) {
		_type = NUMBER;
		_d = (double)x;
	}
	else {
		_type = INT;
		_i = (int)x;
	}
}